

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_eret_mipsel(CPUMIPSState_conflict2 *env)

{
  CPUMIPSState_conflict2 *env_local;
  
  exception_return(env);
  env->CP0_LLAddr = 1;
  env->lladdr = 1;
  return;
}

Assistant:

void helper_eret(CPUMIPSState *env)
{
    exception_return(env);
    env->CP0_LLAddr = 1;
    env->lladdr = 1;
}